

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAProtocol.h
# Opt level: O1

void ComputeChecksumNMEA(char *sentence,int sentencelen,char *checksum)

{
  byte bVar1;
  ulong uVar2;
  
  checksum[0] = '\0';
  checksum[1] = '\0';
  checksum[2] = '\0';
  checksum[3] = '\0';
  uVar2 = 0;
  if (1 < sentencelen) {
    uVar2 = 1;
    bVar1 = 0;
    do {
      if (sentence[uVar2] == 0x2a) break;
      bVar1 = bVar1 ^ sentence[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)sentencelen != uVar2);
    uVar2 = (ulong)bVar1;
  }
  sprintf(checksum,"*%02X",uVar2);
  return;
}

Assistant:

inline void ComputeChecksumNMEA(char* sentence, int sentencelen, char* checksum)
{
	int i = 0;
	char res = 0;

	// +1 for the null terminator character for strings.
	memset(checksum, 0, MAX_NB_BYTES_CHECKSUM_NMEA+1);
	i++; // Exclude start character.
	while (i < sentencelen)
	{
		if (sentence[i] == '*') break;
		res ^= sentence[i];
		i++;
	}
	sprintf(checksum, "*%02X", (int)(unsigned char)res);
	if (checksum[MAX_NB_BYTES_CHECKSUM_NMEA] != 0)
	{
		PRINT_DEBUG_WARNING(("Warning : NMEA checksum computation failed."));
	}
}